

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

int search(ion_bpp_handle_t handle,ion_bpp_buffer_t *buf,void *key,ion_bpp_external_address_t rec,
          ion_bpp_key_t **mkey,ion_bpp_mode_e mode)

{
  ushort uVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  ion_bpp_node_t *piVar5;
  ion_bpp_key_t *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  uVar1 = *(ushort *)buf->p;
  uVar4 = (uint)uVar1;
  iVar7 = (uVar1 >> 1) - 1;
  if (uVar1 < 2) {
    iVar9 = 0;
    bVar2 = 0;
  }
  else {
    bVar2 = 0;
    iVar9 = 0;
    do {
      iVar8 = (iVar9 + iVar7) / 2;
      piVar6 = &buf->p->fkey + (long)iVar8 * (long)*(int *)((long)handle + 0xbc);
      *mkey = piVar6;
      cVar3 = (**(code **)((long)handle + 0x18))(key,piVar6,*(undefined4 *)((long)handle + 8));
      uVar4 = (uint)cVar3;
      if ((cVar3 < '\0') || (mode == MODE_FGEQ && cVar3 == '\0')) goto LAB_00104a4f;
      if ((mode == MODE_LLEQ) || (cVar3 != '\0')) {
LAB_00104a57:
        iVar9 = iVar8 + 1;
      }
      else {
        if (*(int *)((long)handle + 0xc) == 0) {
          return 0;
        }
        if (mode == MODE_MATCH) {
          if (*(long *)(*mkey + *(int *)((long)handle + 8)) <= rec) {
            if (rec <= *(long *)(*mkey + *(int *)((long)handle + 8))) {
              return 0;
            }
            uVar4 = 1;
            goto LAB_00104a57;
          }
          uVar4 = 0xffffffff;
        }
        else {
          uVar4 = 0;
          if (mode != MODE_FIRST) goto LAB_00104a5a;
          if (iVar8 <= iVar9) {
            return 0;
          }
          bVar2 = 1;
          uVar4 = 0;
        }
LAB_00104a4f:
        iVar7 = iVar8 + -1;
      }
LAB_00104a5a:
    } while (iVar9 <= iVar7);
  }
  piVar5 = buf->p;
  if (*(ushort *)piVar5 < 2) {
    *mkey = &piVar5->fkey;
    return -1;
  }
  if ((bool)(mode == MODE_FIRST & bVar2 & *(int *)((long)handle + 0xc) != 0)) {
    *mkey = *mkey + *(int *)((long)handle + 0xbc);
    return 0;
  }
  if (mode == MODE_FGEQ) {
    iVar7 = *(int *)((long)handle + 0xbc);
    *mkey = &piVar5->fkey + (long)iVar7 * (long)iVar9;
    cVar3 = (**(code **)((long)handle + 0x18))
                      (key,&piVar5->fkey + (long)iVar7 * (long)iVar9,
                       *(undefined4 *)((long)handle + 8));
    piVar5 = buf->p;
    if (((int)((*(ushort *)piVar5 >> 1) - 1) <= iVar9) || (-1 < cVar3)) goto LAB_00104bb0;
    lVar10 = (long)iVar9 + 1;
  }
  else {
    if (mode != MODE_LLEQ) {
      return uVar4;
    }
    lVar10 = (long)iVar7;
    iVar9 = *(int *)((long)handle + 0xbc);
    *mkey = &piVar5->fkey + (long)iVar9 * (lVar10 + 1);
    cVar3 = (**(code **)((long)handle + 0x18))
                      (key,&piVar5->fkey + (long)iVar9 * (lVar10 + 1),
                       *(undefined4 *)((long)handle + 8));
    piVar5 = buf->p;
    if ((iVar7 != (*(ushort *)piVar5 >> 1) - 1) && ((iVar7 == -1 || ('\0' < cVar3))))
    goto LAB_00104bb0;
  }
  iVar7 = *(int *)((long)handle + 0xbc);
  *mkey = &piVar5->fkey + iVar7 * lVar10;
  cVar3 = (**(code **)((long)handle + 0x18))
                    (key,&piVar5->fkey + iVar7 * lVar10,*(undefined4 *)((long)handle + 8));
LAB_00104bb0:
  return (int)cVar3;
}

Assistant:

static int
search(
	ion_bpp_handle_t			handle,
	ion_bpp_buffer_t			*buf,
	void						*key,
	ion_bpp_external_address_t	rec,
	ion_bpp_key_t				**mkey,
	ion_bpp_mode_e				mode
) {
	/*
	 * input:
	 *   p					  pointer to node
	 *   key					key to find
	 *   rec					record address (dupkey only)
	 * output:
	 *   k					  pointer to ion_bpp_key_t info
	 * returns:
	 *   CC_EQ				  key = mkey
	 *   CC_LT				  key < mkey
	 *   CC_GT				  key > mkey
	*/
	ion_bpp_h_node_t	*h = handle;
	int					cc;		/* condition code */
	int					m;		/* midpoint of search */
	int					lb;		/* lower-bound of binary search */
	int					ub;		/* upper-bound of binary search */
	ion_bpp_bool_t		foundDup;			/* true if found a duplicate key */

	/* scan current node for key using binary search */
	foundDup	= boolean_false;
	lb			= 0;
	ub			= ct(buf) - 1;

	while (lb <= ub) {
		m		= (lb + ub) / 2;
		*mkey	= fkey(buf) + ks(m);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((cc < 0) || ((cc == 0) && (MODE_FGEQ == mode))) {
			/* key less than key[m] */
			ub = m - 1;
		}
		else if ((cc > 0) || ((cc == 0) && (MODE_LLEQ == mode))) {
			/* key greater than key[m] */
			lb = m + 1;
		}
		else {
			/* keys match */
			if (h->dupKeys) {
				switch (mode) {
					case MODE_FIRST:
						/* backtrack to first key */
						ub = m - 1;

						if (lb > ub) {
							return ION_CC_EQ;
						}

						foundDup = boolean_true;
						break;

					case MODE_MATCH:

						/* rec's must also match */
						if (rec < rec(*mkey)) {
							ub	= m - 1;
							cc	= ION_CC_LT;
						}
						else if (rec > rec(*mkey)) {
							lb	= m + 1;
							cc	= ION_CC_GT;
						}
						else {
							return ION_CC_EQ;
						}

						break;

					case MODE_FGEQ:
					case MODE_LLEQ:	/* nop */
						break;
				}
			}
			else {
				return cc;
			}
		}
	}

	if (ct(buf) == 0) {
		/* empty list */
		*mkey = fkey(buf);
		return ION_CC_LT;
	}

	if (h->dupKeys && (mode == MODE_FIRST) && foundDup) {
		/* next key is first key in set of duplicates */
		*mkey += ks(1);
		return ION_CC_EQ;
	}

	if (MODE_LLEQ == mode) {
		*mkey	= fkey(buf) + ks(ub + 1);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((ub == ct(buf) - 1) || ((ub != -1) && (cc <= 0))) {
			*mkey	= fkey(buf) + ks(ub);
			cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));
		}

		return cc;
	}

	if (MODE_FGEQ == mode) {
		*mkey	= fkey(buf) + ks(lb);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((lb < ct(buf) - 1) && (cc < 0)) {
			*mkey	= fkey(buf) + ks(lb + 1);
			cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));
		}

		return cc;
	}

	/* didn't find key */
	return cc;
}